

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall
BuildTestPhonySelfReference::~BuildTestPhonySelfReference(BuildTestPhonySelfReference *this)

{
  BuildTest::~BuildTest(&this->super_BuildTest);
  operator_delete(this,0x4b8);
  return;
}

Assistant:

TEST_F(BuildTest, PhonySelfReference) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build a: phony a\n"));

  EXPECT_TRUE(builder_.AddTarget("a", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.AlreadyUpToDate());
}